

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O2

int __thiscall iDynTree::BerdyHelper::init(BerdyHelper *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  SensorsList *this_00;
  BerdyOptions *in_RCX;
  SensorsList *in_RDX;
  Model modelCopy;
  BerdyOptions BStack_198;
  Model local_150 [304];
  
  iDynTree::Model::Model(local_150,(Model *)ctx);
  this_00 = (SensorsList *)iDynTree::Model::sensors();
  iDynTree::SensorsList::operator=(this_00,in_RDX);
  BerdyOptions::BerdyOptions(&BStack_198,in_RCX);
  iVar1 = init(this,(EVP_PKEY_CTX *)local_150);
  BerdyOptions::~BerdyOptions(&BStack_198);
  iDynTree::Model::~Model(local_150);
  return iVar1;
}

Assistant:

bool BerdyHelper::init(const Model& model,
                       const SensorsList& sensors,
                       const BerdyOptions options)
{
    Model modelCopy = model;
    modelCopy.sensors() = sensors;
    return init(modelCopy, options);
}